

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O0

void winzip_aes_free(winzip_aes *ctx)

{
  char *__s;
  size_t __n;
  winzip_aes *ctx_local;
  
  if (ctx != (winzip_aes *)0x0) {
    __s = ctx->password;
    __n = strlen(ctx->password);
    memset(__s,0,__n);
    free(ctx->password);
    zip_error_fini(&ctx->error);
    _zip_winzip_aes_free(ctx->aes_ctx);
    free(ctx);
  }
  return;
}

Assistant:

static void
winzip_aes_free(struct winzip_aes *ctx) {
    if (ctx == NULL) {
        return;
    }

    _zip_crypto_clear(ctx->password, strlen(ctx->password));
    free(ctx->password);
    zip_error_fini(&ctx->error);
    _zip_winzip_aes_free(ctx->aes_ctx);
    free(ctx);
}